

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umemstream.h
# Opt level: O0

pos_type __thiscall umembuf::seekoff(umembuf *this,off_type off,seekdir dir,openmode which)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  openmode which_local;
  seekdir dir_local;
  off_type off_local;
  umembuf *this_local;
  
  if (dir == _S_cur) {
    std::streambuf::gbump((int)this);
  }
  else if (dir == _S_end) {
    pcVar1 = (char *)std::streambuf::eback();
    lVar2 = std::streambuf::egptr();
    std::streambuf::egptr();
    std::streambuf::setg((char *)this,pcVar1,(char *)(lVar2 + off));
  }
  else if (dir == _S_beg) {
    pcVar1 = (char *)std::streambuf::eback();
    lVar2 = std::streambuf::eback();
    std::streambuf::egptr();
    std::streambuf::setg((char *)this,pcVar1,(char *)(lVar2 + off));
  }
  lVar2 = std::streambuf::gptr();
  lVar3 = std::streambuf::eback();
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&this_local,lVar2 - lVar3);
  return _this_local;
}

Assistant:

pos_type seekoff(off_type off, std::ios_base::seekdir dir, std::ios_base::openmode which = std::ios_base::in) override
    {
        (void)which;
        if (dir == std::ios_base::cur)
            gbump((int)off);
        else if (dir == std::ios_base::end)
            setg(eback(), egptr() + off, egptr());
        else if (dir == std::ios_base::beg)
            setg(eback(), eback() + off, egptr());
        return gptr() - eback();
    }